

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_tt__GetGlyfOffset(nk_tt_fontinfo *info,int glyph_index)

{
  nk_ushort nVar1;
  nk_uint nVar2;
  int local_38;
  int local_24;
  int local_20;
  int g2;
  int g1;
  int glyph_index_local;
  nk_tt_fontinfo *info_local;
  
  if (glyph_index < info->numGlyphs) {
    if (info->indexToLocFormat < 2) {
      if (info->indexToLocFormat == 0) {
        local_20 = info->glyf;
        nVar1 = nk_ttUSHORT(info->data + (long)(glyph_index << 1) + (long)info->loca);
        local_20 = local_20 + (uint)nVar1 * 2;
        local_24 = info->glyf;
        nVar1 = nk_ttUSHORT(info->data + (long)(glyph_index << 1) + (long)info->loca + 2);
        local_24 = local_24 + (uint)nVar1 * 2;
      }
      else {
        local_20 = info->glyf;
        nVar2 = nk_ttULONG(info->data + (long)(glyph_index << 2) + (long)info->loca);
        local_20 = local_20 + nVar2;
        local_24 = info->glyf;
        nVar2 = nk_ttULONG(info->data + (long)(glyph_index << 2) + (long)info->loca + 4);
        local_24 = local_24 + nVar2;
      }
      if (local_20 == local_24) {
        local_38 = -1;
      }
      else {
        local_38 = local_20;
      }
      info_local._4_4_ = local_38;
    }
    else {
      info_local._4_4_ = -1;
    }
  }
  else {
    info_local._4_4_ = -1;
  }
  return info_local._4_4_;
}

Assistant:

NK_INTERN int
nk_tt__GetGlyfOffset(const struct nk_tt_fontinfo *info, int glyph_index)
{
    int g1,g2;
    if (glyph_index >= info->numGlyphs) return -1; /* glyph index out of range */
    if (info->indexToLocFormat >= 2)    return -1; /* unknown index->glyph map format */

    if (info->indexToLocFormat == 0) {
        g1 = info->glyf + nk_ttUSHORT(info->data + info->loca + glyph_index * 2) * 2;
        g2 = info->glyf + nk_ttUSHORT(info->data + info->loca + glyph_index * 2 + 2) * 2;
    } else {
        g1 = info->glyf + (int)nk_ttULONG (info->data + info->loca + glyph_index * 4);
        g2 = info->glyf + (int)nk_ttULONG (info->data + info->loca + glyph_index * 4 + 4);
    }
    return g1==g2 ? -1 : g1; /* if length is 0, return -1 */
}